

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

void * ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  
  pvVar1 = (void *)((long)ws->allocStart - bytes);
  if (pvVar1 < ws->tableEnd) {
    ws->allocFailed = '\x01';
    return (void *)0x0;
  }
  if (pvVar1 < ws->tableValidEnd) {
    ws->tableValidEnd = pvVar1;
  }
  ws->allocStart = pvVar1;
  return pvVar1;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp* ws, size_t const bytes) {
    void* const alloc = (BYTE*)ws->allocStart - bytes;
    void* const bottom = ws->tableEnd;
    DEBUGLOG(5, "cwksp: reserving %p %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(alloc >= bottom);
    if (alloc < bottom) {
        DEBUGLOG(4, "cwksp: alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    if (alloc < ws->tableValidEnd) {
        ws->tableValidEnd = alloc;
    }
    ws->allocStart = alloc;
    return alloc;
}